

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_pkits_unittest.cc
# Opt level: O0

void bssl::anon_unknown_17::PathBuilderPkitsTestDelegate::RunTest
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *cert_ders,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *crl_ders,PkitsTestInfo *orig_info)

{
  __node_base_ptr *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  uint8_t *data;
  size_t len;
  CRYPTO_BUFFER *__p;
  reference pvVar4;
  size_type sVar5;
  CertPathBuilderResultPath *pCVar6;
  reference this_01;
  pointer certs_00;
  Message *pMVar7;
  CertPathBuilderResultPath *pCVar8;
  char *in_R9;
  AssertHelper local_730;
  Message local_728;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_1;
  Message local_708;
  bool local_6f9;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar;
  CertPathBuilderResultPath *result_path;
  size_t i_1;
  Message msg;
  Result result;
  undefined1 local_670 [8];
  CertPathBuilder path_builder;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_5b0;
  size_t local_5a0;
  char *local_598;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_590;
  size_t local_580;
  char *local_578;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_570;
  size_t local_560;
  char *local_558;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_550;
  size_t local_540;
  char *local_538;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_530;
  size_t local_520;
  char *local_518;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_510;
  size_t local_500;
  char *local_4f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4f0;
  size_t local_4e0;
  char *local_4d8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4d0;
  size_t local_4c0;
  char *local_4b8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4b0;
  size_t local_4a0;
  char *local_498;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_490;
  size_t local_480;
  char *local_478;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_470;
  size_t local_460;
  char *local_458;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_450;
  size_t local_440;
  char *local_438;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_430;
  size_t local_420;
  char *local_418;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_410;
  size_t local_400;
  char *local_3f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3f0;
  size_t local_3e0;
  char *local_3d8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3d0;
  size_t local_3c0;
  char *local_3b8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3b0;
  size_t local_3a0;
  char *local_398;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_390;
  size_t local_380;
  char *local_378;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_370;
  size_t local_360;
  char *local_358;
  undefined1 local_350 [8];
  string_view test_number;
  CrlCheckingPathBuilderDelegate path_builder_delegate;
  AssertHelper local_2e0;
  Message local_2d8;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__2;
  int64_t verify_time;
  shared_ptr<const_bssl::ParsedCertificate> target_cert;
  ulong local_290;
  size_t i;
  CertIssuerSourceStatic cert_issuer_source;
  undefined1 local_238 [8];
  TrustStoreInMemory trust_store;
  AssertHelper local_1a8;
  string local_1a0;
  Message local_180;
  ParseCertificateOptions local_171;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__1;
  CertErrors errors;
  string *der;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ParsedCertificateList certs;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0 [3];
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  PkitsTestInfo info;
  PkitsTestInfo *orig_info_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *crl_ders_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cert_ders_local;
  
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)orig_info;
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)&gtest_ar_.message_,orig_info);
  local_b1 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::empty(cert_ders);
  local_b1 = !local_b1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_b0,(AssertionResult *)"cert_ders.empty()","true","false",
               in_R9);
    pcVar3 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    testing::Message::~Message(local_d0);
  }
  certs.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  certs.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  if (certs.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_00316160;
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            *)&__range2);
  __end2 = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(cert_ders);
  der = (string *)
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(cert_ders);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&der), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&__end2);
    CertErrors::CertErrors((CertErrors *)&gtest_ar__1.message_);
    data = (uint8_t *)::std::__cxx11::string::data();
    len = ::std::__cxx11::string::size();
    __p = CRYPTO_BUFFER_new(data,len,(CRYPTO_BUFFER_POOL *)0x0);
    ::std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&local_170,__p);
    local_171.allow_invalid_serial_numbers = false;
    local_161 = ParsedCertificate::CreateAndAddToVector
                          ((UniquePtr<CRYPTO_BUFFER> *)&local_170,&local_171,
                           (vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                            *)&__range2,(CertErrors *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_160,&local_161,(type *)0x0);
    ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_170);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      CertErrors::ToDebugString_abi_cxx11_(&local_1a0,(CertErrors *)&gtest_ar__1.message_);
      pMVar7 = testing::Message::operator<<(&local_180,&local_1a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &trust_store.distrusted_spkis_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (internal *)local_160,
                 (AssertionResult *)
                 "ParsedCertificate::CreateAndAddToVector( bssl::UniquePtr<CRYPTO_BUFFER>( CRYPTO_BUFFER_new(reinterpret_cast<const uint8_t *>(der.data()), der.size(), nullptr)), {}, &certs, &errors)"
                 ,"false","true",in_R9);
      pcVar3 = (char *)::std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                 ,0x9d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1a8,pMVar7);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      ::std::__cxx11::string::~string
                ((string *)
                 &trust_store.distrusted_spkis_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      testing::Message::~Message(&local_180);
    }
    certs.
    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    certs.
    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    if (certs.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      certs.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    CertErrors::~CertErrors((CertErrors *)&gtest_ar__1.message_);
    if (certs.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_00316154;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  TrustStoreInMemory::TrustStoreInMemory((TrustStoreInMemory *)local_238);
  pvVar4 = ::std::
           vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                         *)&__range2,0);
  this = &cert_issuer_source.intermediates_._M_h._M_single_bucket;
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)this,pvVar4);
  TrustStoreInMemory::AddTrustAnchor
            ((TrustStoreInMemory *)local_238,(shared_ptr<const_bssl::ParsedCertificate> *)this);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)
             &cert_issuer_source.intermediates_._M_h._M_single_bucket);
  CertIssuerSourceStatic::CertIssuerSourceStatic((CertIssuerSourceStatic *)&i);
  for (local_290 = 1;
      sVar5 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(cert_ders), local_290 < sVar5 - 1; local_290 = local_290 + 1) {
    pvVar4 = ::std::
             vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             ::operator[]((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                           *)&__range2,local_290);
    this_00 = &target_cert.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
              ((shared_ptr<const_bssl::ParsedCertificate> *)this_00,pvVar4);
    CertIssuerSourceStatic::AddCert
              ((CertIssuerSourceStatic *)&i,(shared_ptr<const_bssl::ParsedCertificate> *)this_00);
    ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
              ((shared_ptr<const_bssl::ParsedCertificate> *)
               &target_cert.
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pvVar4 = ::std::
           vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ::back((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   *)&__range2);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&verify_time,pvVar4);
  local_2c9 = bssl::der::GeneralizedTimeToPosixTime
                        ((GeneralizedTime *)&info.initial_policy_mapping_inhibit,
                         (int64_t *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&path_builder_delegate.max_age_,(internal *)local_2c8,
               (AssertionResult *)"der::GeneralizedTimeToPosixTime(info.time, &verify_time)","false"
               ,"true",in_R9);
    pcVar3 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
               ,0xaf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    ::std::__cxx11::string::~string((string *)&path_builder_delegate.max_age_);
    testing::Message::~Message(&local_2d8);
  }
  certs.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  certs.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  if (certs.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    CrlCheckingPathBuilderDelegate::CrlCheckingPathBuilderDelegate
              ((CrlCheckingPathBuilderDelegate *)&test_number._M_str,crl_ders,
               (int64_t)gtest_ar__2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,0x3c26700,0x400,kMaxValue);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_350,
               (char *)gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    local_360 = (size_t)local_350;
    local_358 = (char *)test_number._M_len;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_370,"4.4.19");
    __x_18._M_str = local_358;
    __x_18._M_len = local_360;
    bVar1 = ::std::operator==(__x_18,local_370);
    if (bVar1) {
LAB_00315577:
      info.time.year._0_1_ = 0;
    }
    else {
      local_380 = (size_t)local_350;
      local_378 = (char *)test_number._M_len;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_390,"4.5.3")
      ;
      __x_17._M_str = local_378;
      __x_17._M_len = local_380;
      bVar1 = ::std::operator==(__x_17,local_390);
      if (bVar1) goto LAB_00315577;
      local_3a0 = (size_t)local_350;
      local_398 = (char *)test_number._M_len;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b0,"4.5.4")
      ;
      __x_16._M_str = local_398;
      __x_16._M_len = local_3a0;
      bVar1 = ::std::operator==(__x_16,local_3b0);
      if (bVar1) goto LAB_00315577;
      local_3c0 = (size_t)local_350;
      local_3b8 = (char *)test_number._M_len;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3d0,"4.5.6")
      ;
      __x_15._M_str = local_3b8;
      __x_15._M_len = local_3c0;
      bVar1 = ::std::operator==(__x_15,local_3d0);
      if (bVar1) goto LAB_00315577;
      local_3e0 = (size_t)local_350;
      local_3d8 = (char *)test_number._M_len;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3f0,"4.14.1");
      __x_14._M_str = local_3d8;
      __x_14._M_len = local_3e0;
      bVar1 = ::std::operator==(__x_14,local_3f0);
      if (bVar1) {
LAB_00315a03:
        info.time.year._0_1_ = 0;
      }
      else {
        local_400 = (size_t)local_350;
        local_3f8 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_410,"4.14.4");
        __x_13._M_str = local_3f8;
        __x_13._M_len = local_400;
        bVar1 = ::std::operator==(__x_13,local_410);
        if (bVar1) goto LAB_00315a03;
        local_420 = (size_t)local_350;
        local_418 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_430,"4.14.5");
        __x_12._M_str = local_418;
        __x_12._M_len = local_420;
        bVar1 = ::std::operator==(__x_12,local_430);
        if (bVar1) goto LAB_00315a03;
        local_440 = (size_t)local_350;
        local_438 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_450,"4.14.7");
        __x_11._M_str = local_438;
        __x_11._M_len = local_440;
        bVar1 = ::std::operator==(__x_11,local_450);
        if (bVar1) goto LAB_00315a03;
        local_460 = (size_t)local_350;
        local_458 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_470,"4.14.18");
        __x_10._M_str = local_458;
        __x_10._M_len = local_460;
        bVar1 = ::std::operator==(__x_10,local_470);
        if (bVar1) goto LAB_00315a03;
        local_480 = (size_t)local_350;
        local_478 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_490,"4.14.19");
        __x_09._M_str = local_478;
        __x_09._M_len = local_480;
        bVar1 = ::std::operator==(__x_09,local_490);
        if (bVar1) goto LAB_00315a03;
        local_4a0 = (size_t)local_350;
        local_498 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_4b0,"4.14.22");
        __x_08._M_str = local_498;
        __x_08._M_len = local_4a0;
        bVar1 = ::std::operator==(__x_08,local_4b0);
        if (bVar1) goto LAB_00315a03;
        local_4c0 = (size_t)local_350;
        local_4b8 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_4d0,"4.14.24");
        __x_07._M_str = local_4b8;
        __x_07._M_len = local_4c0;
        bVar1 = ::std::operator==(__x_07,local_4d0);
        if (bVar1) goto LAB_00315a03;
        local_4e0 = (size_t)local_350;
        local_4d8 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_4f0,"4.14.25");
        __x_06._M_str = local_4d8;
        __x_06._M_len = local_4e0;
        bVar1 = ::std::operator==(__x_06,local_4f0);
        if (bVar1) goto LAB_00315a03;
        local_500 = (size_t)local_350;
        local_4f8 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_510,"4.14.28");
        __x_05._M_str = local_4f8;
        __x_05._M_len = local_500;
        bVar1 = ::std::operator==(__x_05,local_510);
        if (bVar1) goto LAB_00315a03;
        local_520 = (size_t)local_350;
        local_518 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_530,"4.14.29");
        __x_04._M_str = local_518;
        __x_04._M_len = local_520;
        bVar1 = ::std::operator==(__x_04,local_530);
        if (bVar1) goto LAB_00315a03;
        local_540 = (size_t)local_350;
        local_538 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_550,"4.14.30");
        __x_03._M_str = local_538;
        __x_03._M_len = local_540;
        bVar1 = ::std::operator==(__x_03,local_550);
        if (bVar1) goto LAB_00315a03;
        local_560 = (size_t)local_350;
        local_558 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_570,"4.14.33");
        __x_02._M_str = local_558;
        __x_02._M_len = local_560;
        bVar1 = ::std::operator==(__x_02,local_570);
        if (bVar1) goto LAB_00315a03;
        local_580 = (size_t)local_350;
        local_578 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_590,"4.15.1");
        __x_01._M_str = local_578;
        __x_01._M_len = local_580;
        bVar1 = ::std::operator==(__x_01,local_590);
        if (bVar1) {
LAB_00315ab6:
          info.time.year._0_1_ = 0;
        }
        else {
          local_5a0 = (size_t)local_350;
          local_598 = (char *)test_number._M_len;
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_5b0,"4.15.5");
          __x_00._M_str = local_598;
          __x_00._M_len = local_5a0;
          bVar1 = ::std::operator==(__x_00,local_5b0);
          if (bVar1) goto LAB_00315ab6;
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &path_builder.valid_path_count_,"4.15.4");
          __x._M_str = (char *)test_number._M_len;
          __x._M_len = (size_t)local_350;
          bVar1 = ::std::operator==(__x,stack0xfffffffffffffa30);
          if (bVar1) {
            info.time.year._0_1_ = 1;
          }
        }
      }
    }
    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
              ((shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit,
               (shared_ptr<const_bssl::ParsedCertificate> *)&verify_time);
    CertPathBuilder::CertPathBuilder
              ((CertPathBuilder *)local_670,
               (shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit,
               (TrustStore *)local_238,(CertPathBuilderDelegate *)&test_number._M_str,
               (GeneralizedTime *)&info.initial_policy_mapping_inhibit,ANY_EKU,
               (InitialExplicitPolicy)
               info.initial_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (set<bssl::der::Input,_std::less<bssl::der::Input>,_std::allocator<bssl::der::Input>_>
                *)&info,info.initial_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count.
                        _4_4_,info.initial_explicit_policy);
    ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
              ((shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit);
    CertPathBuilder::AddCertIssuerSource((CertPathBuilder *)local_670,(CertIssuerSource *)&i);
    CertPathBuilder::Run((Result *)&msg,(CertPathBuilder *)local_670);
    bVar1 = (bool)((byte)info.time.year & 1);
    bVar2 = CertPathBuilder::Result::HasValidPath((Result *)&msg);
    if (bVar1 == bVar2) {
LAB_00315f81:
      bVar1 = CertPathBuilder::Result::HasValidPath((Result *)&msg);
      if (bVar1) {
        pCVar8 = CertPathBuilder::Result::GetBestValidPath((Result *)&msg);
        testing::internal::EqHelper::
        Compare<std::set<bssl::der::Input,_std::less<bssl::der::Input>,_std::allocator<bssl::der::Input>_>,_std::set<bssl::der::Input,_std::less<bssl::der::Input>,_std::allocator<bssl::der::Input>_>,_nullptr>
                  ((EqHelper *)local_720,"info.user_constrained_policy_set",
                   "result.GetBestValidPath()->user_constrained_policy_set",
                   (set<bssl::der::Input,_std::less<bssl::der::Input>,_std::allocator<bssl::der::Input>_>
                    *)&info.time.hours,&pCVar8->user_constrained_policy_set);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
        if (!bVar1) {
          testing::Message::Message(&local_728);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
          testing::internal::AssertHelper::AssertHelper
                    (&local_730,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                     ,0x102,pcVar3);
          testing::internal::AssertHelper::operator=(&local_730,&local_728);
          testing::internal::AssertHelper::~AssertHelper(&local_730);
          testing::Message::~Message(&local_728);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
      }
      certs.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    else {
      testing::Message::Message((Message *)&i_1);
      for (result_path = (CertPathBuilderResultPath *)0x0; pCVar8 = result_path,
          pCVar6 = (CertPathBuilderResultPath *)
                   ::std::
                   vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                   ::size((vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                           *)&msg), pCVar8 < pCVar6;
          result_path = (CertPathBuilderResultPath *)
                        ((long)&(result_path->certs).
                                super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1)) {
        this_01 = ::std::
                  vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                  ::operator[]((vector<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                                *)&msg,(size_type)result_path);
        certs_00 = ::std::
                   unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                   ::get(this_01);
        pMVar7 = testing::Message::operator<<((Message *)&i_1,(char (*) [6])"path ");
        pMVar7 = testing::Message::operator<<(pMVar7,(unsigned_long *)&result_path);
        pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [10])" errors:\n");
        CertPathErrors::ToDebugString_abi_cxx11_
                  ((string *)&gtest_ar.message_,&certs_00->errors,&certs_00->certs);
        pMVar7 = testing::Message::operator<<
                           (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&gtest_ar.message_);
        testing::Message::operator<<(pMVar7,(char (*) [2])0x739f88);
        ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
      }
      local_6f9 = CertPathBuilder::Result::HasValidPath((Result *)&msg);
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                ((EqHelper *)local_6f8,"info.should_validate","result.HasValidPath()",
                 (bool *)&info.time,&local_6f9);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
      if (!bVar1) {
        testing::Message::Message(&local_708);
        pMVar7 = testing::Message::operator<<(&local_708,(Message *)&i_1);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                   ,0xfd,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar7);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_708);
      }
      certs.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      certs.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
      if (certs.
          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        certs.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      testing::Message::~Message((Message *)&i_1);
      if (certs.
          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) goto LAB_00315f81;
    }
    CertPathBuilder::Result::~Result((Result *)&msg);
    CertPathBuilder::~CertPathBuilder((CertPathBuilder *)local_670);
    CrlCheckingPathBuilderDelegate::~CrlCheckingPathBuilderDelegate
              ((CrlCheckingPathBuilderDelegate *)&test_number._M_str);
  }
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&verify_time);
  CertIssuerSourceStatic::~CertIssuerSourceStatic((CertIssuerSourceStatic *)&i);
  TrustStoreInMemory::~TrustStoreInMemory((TrustStoreInMemory *)local_238);
LAB_00316154:
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             *)&__range2);
LAB_00316160:
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)&gtest_ar_.message_);
  return;
}

Assistant:

static void RunTest(std::vector<std::string> cert_ders,
                      std::vector<std::string> crl_ders,
                      const PkitsTestInfo &orig_info) {
    PkitsTestInfo info = orig_info;

    ASSERT_FALSE(cert_ders.empty());
    ParsedCertificateList certs;
    for (const std::string &der : cert_ders) {
      CertErrors errors;
      ASSERT_TRUE(ParsedCertificate::CreateAndAddToVector(
          bssl::UniquePtr<CRYPTO_BUFFER>(
              CRYPTO_BUFFER_new(reinterpret_cast<const uint8_t *>(der.data()),
                                der.size(), nullptr)),
          {}, &certs, &errors))
          << errors.ToDebugString();
    }
    // First entry in the PKITS chain is the trust anchor.
    // TODO(mattm): test with all possible trust anchors in the trust store?
    TrustStoreInMemory trust_store;

    trust_store.AddTrustAnchor(certs[0]);

    // TODO(mattm): test with other irrelevant certs in cert_issuer_sources?
    CertIssuerSourceStatic cert_issuer_source;
    for (size_t i = 1; i < cert_ders.size() - 1; ++i) {
      cert_issuer_source.AddCert(certs[i]);
    }

    std::shared_ptr<const ParsedCertificate> target_cert(certs.back());

    int64_t verify_time;
    ASSERT_TRUE(der::GeneralizedTimeToPosixTime(info.time, &verify_time));
    CrlCheckingPathBuilderDelegate path_builder_delegate(
        crl_ders, verify_time, /*max_age=*/kOneYear * 2, 1024,
        SimplePathBuilderDelegate::DigestPolicy::kWeakAllowSha1);

    std::string_view test_number = info.test_number;
    if (test_number == "4.4.19" || test_number == "4.5.3" ||
        test_number == "4.5.4" || test_number == "4.5.6") {
      // 4.4.19 - fails since CRL is signed by a certificate that is not part
      //          of the verified chain, which is not supported.
      // 4.5.3 - fails since non-URI distribution point names are not supported
      // 4.5.4, 4.5.6 - fails since CRL is signed by a certificate that is not
      //                part of verified chain, and also non-URI distribution
      //                point names not supported
      info.should_validate = false;
    } else if (test_number == "4.14.1" || test_number == "4.14.4" ||
               test_number == "4.14.5" || test_number == "4.14.7" ||
               test_number == "4.14.18" || test_number == "4.14.19" ||
               test_number == "4.14.22" || test_number == "4.14.24" ||
               test_number == "4.14.25" || test_number == "4.14.28" ||
               test_number == "4.14.29" || test_number == "4.14.30" ||
               test_number == "4.14.33") {
      // 4.14 tests:
      // .1 - fails since non-URI distribution point names not supported
      // .2, .3 - fails since non-URI distribution point names not supported
      //          (but test is expected to fail for other reason)
      // .4, .5 - fails since non-URI distribution point names not supported,
      //          also uses nameRelativeToCRLIssuer which is not supported
      // .6 - fails since non-URI distribution point names not supported, also
      //      uses nameRelativeToCRLIssuer which is not supported (but test is
      //      expected to fail for other reason)
      // .7 - fails since relative distributionPointName not supported
      // .8, .9 - fails since relative distributionPointName not supported (but
      //          test is expected to fail for other reason)
      // .10, .11, .12, .13, .14, .27, .35 - PASS
      // .15, .16, .17, .20, .21 - fails since onlySomeReasons is not supported
      //                           (but test is expected to fail for other
      //                           reason)
      // .18, .19 - fails since onlySomeReasons is not supported
      // .22, .24, .25, .28, .29, .30, .33 - fails since indirect CRLs are not
      //                                     supported
      // .23, .26, .31, .32, .34 - fails since indirect CRLs are not supported
      //                           (but test is expected to fail for other
      //                           reason)
      info.should_validate = false;
    } else if (test_number == "4.15.1" || test_number == "4.15.5") {
      // 4.15 tests:
      // .1 - fails due to unhandled critical deltaCRLIndicator extension
      // .2, .3, .6, .7, .8, .9, .10 - PASS since expected cert status is
      //                               reflected in base CRL and delta CRL is
      //                               ignored
      // .5 - fails, cert status is "on hold" in base CRL but the delta CRL
      //      which removes the cert from CRL is ignored
      info.should_validate = false;
    } else if (test_number == "4.15.4") {
      // 4.15.4 - Invalid delta-CRL Test4 has the target cert marked revoked in
      // a delta-CRL. Since delta-CRLs are not supported, the chain validates
      // successfully.
      info.should_validate = true;
    }

    CertPathBuilder path_builder(
        std::move(target_cert), &trust_store, &path_builder_delegate, info.time,
        KeyPurpose::ANY_EKU, info.initial_explicit_policy,
        info.initial_policy_set, info.initial_policy_mapping_inhibit,
        info.initial_inhibit_any_policy);
    path_builder.AddCertIssuerSource(&cert_issuer_source);

    CertPathBuilder::Result result = path_builder.Run();

    if (info.should_validate != result.HasValidPath()) {
      testing::Message msg;
      for (size_t i = 0; i < result.paths.size(); ++i) {
        const bssl::CertPathBuilderResultPath *result_path =
            result.paths[i].get();
        msg << "path " << i << " errors:\n"
            << result_path->errors.ToDebugString(result_path->certs) << "\n";
      }
      ASSERT_EQ(info.should_validate, result.HasValidPath()) << msg;
    }

    if (result.HasValidPath()) {
      EXPECT_EQ(info.user_constrained_policy_set,
                result.GetBestValidPath()->user_constrained_policy_set);
    }
  }